

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Pipeline * __thiscall
capnp::anon_unknown_34::BrokenRequest::sendForPipeline
          (Pipeline *__return_storage_ptr__,BrokenRequest *this)

{
  PipelineHook *pPVar1;
  Refcounted *refcounted;
  
  pPVar1 = (PipelineHook *)operator_new(0x1a8);
  *(undefined4 *)&pPVar1[2]._vptr_PipelineHook = 0;
  pPVar1->_vptr_PipelineHook = (_func_int **)&PTR_addRef_0037b278;
  pPVar1[1]._vptr_PipelineHook = (_func_int **)&DAT_0037b2b0;
  kj::Exception::Exception((Exception *)(pPVar1 + 3),&this->exception);
  *(int *)&pPVar1[2]._vptr_PipelineHook = *(int *)&pPVar1[2]._vptr_PipelineHook + 1;
  (__return_storage_ptr__->hook).disposer = (Disposer *)(pPVar1 + 1);
  (__return_storage_ptr__->hook).ptr = pPVar1;
  (__return_storage_ptr__->ops).ptr = (PipelineOp *)0x0;
  (__return_storage_ptr__->ops).size_ = 0;
  (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)0x0;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline sendForPipeline() override {
    return AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception));
  }